

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  Cookie *co;
  char *pcVar8;
  char *__s;
  char *pcVar9;
  size_t sVar10;
  undefined8 *__base;
  Cookie *co_00;
  Cookie *pCVar11;
  size_t __nmemb;
  
  sVar6 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar6] != (Cookie *)0x0)) {
    remove_expired(c);
    _Var3 = isip(host);
    pCVar11 = c->cookies[sVar6];
    if (pCVar11 == (Cookie *)0x0) {
      __nmemb = 0;
      co_00 = (Cookie *)0x0;
    }
    else {
      co_00 = (Cookie *)0x0;
      __nmemb = 0;
      do {
        if (((byte)(pCVar11->secure ^ 1U | secure) != 1) ||
           (((pCVar11->domain != (char *)0x0 &&
             (((~pCVar11->tailmatch & 1U) != 0 || _Var3 ||
              (_Var4 = tailmatch(pCVar11->domain,host), !_Var4)))) &&
            (((~pCVar11->tailmatch & 1U) == 0 && !_Var3 ||
             (iVar5 = Curl_strcasecompare(host,pCVar11->domain), iVar5 == 0)))))) goto LAB_0056a164;
        pcVar8 = pCVar11->spath;
        if ((pcVar8 == (char *)0x0) || (sVar7 = strlen(pcVar8), sVar7 == 1)) goto LAB_00569f78;
        __s = (*Curl_cstrdup)(path);
        if (__s != (char *)0x0) {
          pcVar9 = strchr(__s,0x3f);
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (*Curl_cstrdup)("/");
            if (__s == (char *)0x0) goto LAB_0056a164;
          }
          sVar10 = strlen(__s);
          if ((sVar10 < sVar7) || (iVar5 = strncmp(pcVar8,__s,sVar7), iVar5 != 0)) {
            (*Curl_cfree)(__s);
          }
          else {
            if (sVar7 == sVar10) {
              (*Curl_cfree)(__s);
            }
            else {
              cVar1 = __s[sVar7];
              (*Curl_cfree)(__s);
              if (cVar1 != '/') goto LAB_0056a164;
            }
LAB_00569f78:
            co = (Cookie *)(*Curl_ccalloc)(0x68,1);
            if (co != (Cookie *)0x0) {
              if (pCVar11->expirestr == (char *)0x0) {
LAB_00569fb6:
                if (pCVar11->domain != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->domain);
                  co->domain = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->path != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->path);
                  co->path = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->spath != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->spath);
                  co->spath = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->name != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->name);
                  co->name = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->value != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->value);
                  co->value = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->maxage != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->maxage);
                  co->maxage = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                if (pCVar11->version != (char *)0x0) {
                  pcVar8 = (*Curl_cstrdup)(pCVar11->version);
                  co->version = pcVar8;
                  if (pcVar8 == (char *)0x0) goto LAB_0056a0ac;
                }
                co->expires = pCVar11->expires;
                co->tailmatch = pCVar11->tailmatch;
                co->secure = pCVar11->secure;
                co->livecookie = pCVar11->livecookie;
                co->httponly = pCVar11->httponly;
                co->creationtime = pCVar11->creationtime;
              }
              else {
                pcVar8 = (*Curl_cstrdup)(pCVar11->expirestr);
                co->expirestr = pcVar8;
                if (pcVar8 != (char *)0x0) goto LAB_00569fb6;
LAB_0056a0ac:
                freecookie(co);
                co = (Cookie *)0x0;
              }
            }
            if (co == (Cookie *)0x0) goto joined_r0x0056a250;
            co->next = co_00;
            __nmemb = __nmemb + 1;
            co_00 = co;
          }
        }
LAB_0056a164:
        pCVar11 = pCVar11->next;
      } while (pCVar11 != (Cookie *)0x0);
    }
    if (__nmemb == 0) {
      return co_00;
    }
    __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
    puVar2 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; co_00 != (Cookie *)0x0; co_00 = co_00->next) {
        *puVar2 = co_00;
        puVar2 = puVar2 + 1;
      }
      qsort(__base,__nmemb,8,cookie_sort);
      co_00 = (Cookie *)*__base;
      if (__nmemb != 1) {
        sVar7 = 1;
        do {
          *(undefined8 *)__base[sVar7 - 1] = __base[sVar7];
          sVar7 = sVar7 + 1;
        } while (__nmemb != sVar7);
      }
      *(undefined8 *)__base[__nmemb - 1] = 0;
      (*Curl_cfree)(__base);
    }
    if (__base != (undefined8 *)0x0) {
      return co_00;
    }
joined_r0x0056a250:
    while (co_00 != (Cookie *)0x0) {
      pCVar11 = co_00->next;
      freecookie(co_00);
      co_00 = pCVar11;
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}